

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<restaurant_*,_std::allocator<restaurant_*>_> * __thiscall
graph::getAdjacent(vector<restaurant_*,_std::allocator<restaurant_*>_> *__return_storage_ptr__,
                  graph *this,restaurant *vertex)

{
  _Rb_tree_header *p_Var1;
  pointer *ppprVar2;
  int iVar3;
  iterator __position;
  pointer pprVar4;
  pointer pprVar5;
  long lVar6;
  mapped_type *pmVar7;
  mapped_type *__x;
  mapped_type *__args;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  int key;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> list;
  int local_54;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_50;
  restaurant *local_38;
  
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = vertex;
  pmVar7 = std::__detail::
           _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->mapper,&local_38);
  p_Var8 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = &(this->v)._M_t._M_impl.super__Rb_tree_header;
    iVar3 = *pmVar7;
    p_Var9 = &p_Var1->_M_header;
    do {
      if (iVar3 <= (int)p_Var8[1]._M_color) {
        p_Var9 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar3];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != p_Var1) && ((int)p_Var9[1]._M_color <= iVar3)) {
      pmVar7 = std::__detail::
               _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->mapper,&local_38);
      __x = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,pmVar7);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_50,__x)
      ;
      if (local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          local_54 = local_50.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar10].first;
          p_Var8 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &p_Var1->_M_header;
          if (p_Var8 != (_Base_ptr)0x0) {
            do {
              if (local_54 <= (int)*(size_t *)(p_Var8 + 1)) {
                p_Var9 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < local_54];
            } while (p_Var8 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
               ((int)((_Rb_tree_header *)p_Var9)->_M_node_count <= local_54)) {
              __args = std::__detail::
                       _Map_base<int,_std::pair<const_int,_restaurant_*>,_std::allocator<std::pair<const_int,_restaurant_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_restaurant_*>,_std::allocator<std::pair<const_int,_restaurant_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->reverseMapper,&local_54);
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<restaurant*,std::allocator<restaurant*>>::
                _M_realloc_insert<restaurant*const&>
                          ((vector<restaurant*,std::allocator<restaurant*>> *)__return_storage_ptr__
                           ,__position,__args);
              }
              else {
                *__position._M_current = *__args;
                ppprVar2 = &(__return_storage_ptr__->
                            super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl
                            .super__Vector_impl_data._M_finish;
                *ppprVar2 = *ppprVar2 + 1;
              }
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)local_50.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_50.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
        pprVar4 = (__return_storage_ptr__->
                  super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pprVar5 = (__return_storage_ptr__->
                  super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pprVar4 != pprVar5) {
          uVar10 = (long)pprVar5 - (long)pprVar4 >> 3;
          lVar6 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<restaurant**,std::vector<restaurant*,std::allocator<restaurant*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pprVar4,pprVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<restaurant**,std::vector<restaurant*,std::allocator<restaurant*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pprVar4,pprVar5);
        }
      }
      if (local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<restaurant *> graph::getAdjacent(restaurant *vertex)
{
    vector<restaurant *> adj;
    if (v.find(mapper[vertex]) == v.end())
    {
        return adj;
    }
    vector<pair<int, int>> list = theGraph[mapper[vertex]];

    for (int i = 0; i < list.size(); i++)
    {
        // find vertex to add
        int key = list[i].first;
        if (v.find(key) != v.end())
        {
            adj.push_back(reverseMapper[key]);
        }
    }

    sort(adj.begin(), adj.end());
    return adj;
}